

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

void __thiscall QLocale::QLocale(QLocale *this,QStringView name)

{
  long lVar1;
  QLocalePrivate *in_RDI;
  long in_FS_OFFSET;
  undefined1 in_stack_000000a0 [16];
  QLocalePrivate *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  localePrivateByName((QStringView)in_stack_000000a0);
  QSharedDataPointer<QLocalePrivate>::QSharedDataPointer
            ((QSharedDataPointer<QLocalePrivate> *)this_00,in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QLocale::QLocale(QStringView name)
    : d(localePrivateByName(name))
{
}